

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O3

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate
          (pair<subprocess::Buffer,_subprocess::Buffer> *__return_storage_ptr__,Communication *this,
          char *msg,size_t length)

{
  Streams *pSVar1;
  FILE *__stream;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  ssize_t sVar7;
  OSError *pOVar8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar10;
  pointer pcVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  vector<char,_std::allocator<char>_> local_b8;
  size_t sStack_a0;
  vector<char,_std::allocator<char>_> local_98;
  size_t sStack_80;
  string local_70;
  FILE *local_50;
  element_type *local_48;
  element_type *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = this->stream_;
  local_50 = (FILE *)(pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
  local_48 = (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar9 = 0;
  lVar10 = 0;
  do {
    iVar9 = iVar9 + (uint)(*(long *)((long)&local_50 + lVar10) == 0);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x18);
  if (iVar9 < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      communicate_threaded(__return_storage_ptr__,this,msg,length);
      return __return_storage_ptr__;
    }
    goto LAB_0072980c;
  }
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sStack_80 = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sStack_a0 = 0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (local_50 == (FILE *)0x0) {
    if (local_48 != (element_type *)0x0) {
      std::vector<char,_std::allocator<char>_>::resize(&local_98,this->out_buf_cap_);
      __stream = (FILE *)(this->stream_->output_).
                         super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar10 = (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      iVar9 = 0;
      pcVar11 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar13 = (int)lVar10;
        iVar3 = fileno(__stream);
        iVar14 = 0;
        iVar12 = 0;
        while( true ) {
          while( true ) {
            sVar7 = read(iVar3,pcVar11 + iVar14,(long)iVar13 - (long)iVar14);
            iVar4 = (int)sVar7;
            if (iVar4 != -1) break;
            piVar6 = __errno_location();
            if ((*piVar6 != 4) || (0x31 < iVar12)) goto LAB_00729461;
            iVar12 = iVar12 + 1;
          }
          if (iVar4 == 0) break;
          iVar14 = iVar14 + iVar4;
        }
        if (iVar14 == -1) {
LAB_00729461:
          if (iVar9 == 0) goto LAB_0072965f;
          goto LAB_00729471;
        }
        if (iVar14 != iVar13) goto LAB_007295d3;
        lVar10 = (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        std::vector<char,_std::allocator<char>_>::resize(&local_98,lVar10 * 2);
        iVar9 = iVar9 + iVar13;
        pcVar11 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar9;
      } while( true );
    }
    if (local_40 != (element_type *)0x0) {
      std::vector<char,_std::allocator<char>_>::resize(&local_b8,this->err_buf_cap_);
      pcVar2 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar11 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar9 = fileno((FILE *)(this->stream_->error_).
                             super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar3 = 0;
      iVar13 = 0;
      while( true ) {
        while( true ) {
          sVar7 = read(iVar9,pcVar11 + iVar3,(long)pcVar2 - (long)(pcVar11 + iVar3));
          iVar12 = (int)sVar7;
          if (iVar12 != -1) break;
          piVar6 = __errno_location();
          if ((*piVar6 != 4) || (0x31 < iVar13)) goto LAB_007295e3;
          iVar13 = iVar13 + 1;
        }
        if (iVar12 == 0) break;
        iVar3 = iVar3 + iVar12;
      }
      if (iVar3 == -1) {
LAB_007295e3:
        pOVar8 = (OSError *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"read to ebuf failed","");
        piVar6 = __errno_location();
        OSError::OSError(pOVar8,&local_70,*piVar6);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pOVar8,&OSError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0072980c;
      }
      pSVar1 = this->stream_;
      (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      sStack_a0 = (long)iVar3;
      goto LAB_00729568;
    }
  }
  else {
    if ((msg != (char *)0x0) && (sVar5 = fwrite(msg,1,length,local_50), (int)sVar5 < (int)length)) {
      piVar6 = __errno_location();
      if ((*piVar6 != 0x16) && (*piVar6 != 0x20)) {
        pOVar8 = (OSError *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fwrite error","");
        OSError::OSError(pOVar8,&local_70,*piVar6);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pOVar8,&OSError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0072980c;
      }
    }
    pSVar1 = this->stream_;
    (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00 = (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00729568:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->first).length = sStack_80;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->second).length = sStack_a0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0072980c:
  __stack_chk_fail();
LAB_007295d3:
  iVar9 = iVar9 + iVar14;
LAB_00729471:
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + iVar9 !=
      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + iVar9;
  }
  if (iVar9 == -1) {
LAB_0072965f:
    pOVar8 = (OSError *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"read to obuf failed","");
    piVar6 = __errno_location();
    OSError::OSError(pOVar8,&local_70,*piVar6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pOVar8,&OSError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0072980c;
  }
  pSVar1 = this->stream_;
  (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00 = (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_80 = (long)iVar9;
  goto LAB_00729568;
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate(const char* msg, size_t length)
  {
    // Optimization from subprocess.py
    // If we are using one pipe, or no pipe
    // at all, using select() or threads is unnecessary.
    auto hndls = {stream_->input(), stream_->output(), stream_->error()};
    int count = std::count(std::begin(hndls), std::end(hndls), nullptr);
    const int len_conv = length;

    if (count >= 2) {
      OutBuffer obuf;
      ErrBuffer ebuf;
      if (stream_->input()) {
        if (msg) {
          int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
          if (wbytes < len_conv) {
            if (errno != EPIPE && errno != EINVAL) {
              throw OSError("fwrite error", errno);
            }
          }
        }
        // Close the input stream
        stream_->input_.reset();
      } else if (stream_->output()) {
        // Read till EOF
        // ATTN: This could be blocking, if the process
        // at the other end screws up, we get screwed as well
        obuf.add_cap(out_buf_cap_);

        int rbytes = util::read_all(
                            stream_->output(),
                            obuf.buf);

        if (rbytes == -1) {
          throw OSError("read to obuf failed", errno);
        }

        obuf.length = rbytes;
        // Close the output stream
        stream_->output_.reset();

      } else if (stream_->error()) {
        // Same screwness applies here as well
        ebuf.add_cap(err_buf_cap_);

        int rbytes = util::read_atmost_n(
                                  stream_->error(),
                                  ebuf.buf.data(),
                                  ebuf.buf.size());

        if (rbytes == -1) {
          throw OSError("read to ebuf failed", errno);
        }

        ebuf.length = rbytes;
        // Close the error stream
        stream_->error_.reset();
      }
      return std::make_pair(std::move(obuf), std::move(ebuf));
    }

    return communicate_threaded(msg, length);
  }